

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.c
# Opt level: O3

void base64_stream_encode_avx(base64_state *state,char *src,size_t srclen,char *out,size_t *outlen)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  size_t sVar6;
  undefined1 (*pauVar7) [16];
  ulong uVar8;
  undefined1 (*pauVar9) [16];
  byte bVar10;
  uint uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  uVar11 = state->bytes;
  sVar6 = 0;
  bVar10 = state->carry;
  if ((ulong)uVar11 == 2) goto LAB_00106c20;
  if (uVar11 == 1) goto LAB_00106be6;
  uVar8 = (ulong)uVar11;
  if (uVar11 == 0) {
    do {
      sVar6 = uVar8;
      auVar5 = _DAT_0010cff0;
      auVar4 = _DAT_0010cf80;
      if (0xf < srclen) {
        uVar8 = (srclen - 4) / 0xc;
        srclen = srclen + uVar8 * -0xc;
        sVar6 = uVar8 * 0x10 + sVar6;
        auVar13._8_4_ = 0xfc0fc00;
        auVar13._0_8_ = 0xfc0fc000fc0fc00;
        auVar13._12_4_ = 0xfc0fc00;
        auVar14._8_4_ = 0x4000040;
        auVar14._0_8_ = 0x400004004000040;
        auVar14._12_4_ = 0x4000040;
        auVar15._8_4_ = 0x3f03f0;
        auVar15._0_8_ = 0x3f03f0003f03f0;
        auVar15._12_4_ = 0x3f03f0;
        auVar16._8_4_ = 0x33333333;
        auVar16._0_8_ = 0x3333333333333333;
        auVar16._12_4_ = 0x33333333;
        auVar17._8_4_ = 0x19191919;
        auVar17._0_8_ = 0x1919191919191919;
        auVar17._12_4_ = 0x19191919;
        auVar18._8_4_ = 0xfc0fc00;
        auVar18._0_8_ = 0xfc0fc000fc0fc00;
        auVar18._12_4_ = 0xfc0fc00;
        auVar19._8_4_ = 0x4000040;
        auVar19._0_8_ = 0x400004004000040;
        auVar19._12_4_ = 0x4000040;
        auVar20._8_4_ = 0x3f03f0;
        auVar20._0_8_ = 0x3f03f0003f03f0;
        auVar20._12_4_ = 0x3f03f0;
        auVar21._8_4_ = 0x33333333;
        auVar21._0_8_ = 0x3333333333333333;
        auVar21._12_4_ = 0x33333333;
        auVar22._8_4_ = 0x19191919;
        auVar22._0_8_ = 0x1919191919191919;
        auVar22._12_4_ = 0x19191919;
        pauVar7 = (undefined1 (*) [16])out;
        pauVar9 = (undefined1 (*) [16])src;
        do {
          if (uVar8 < 8) {
            lVar12 = -4;
            if (3 < uVar8) goto LAB_001069fd;
            src = *pauVar9 + 0xc;
            out = (char *)(pauVar7 + 1);
            auVar24 = vpshufb_avx(*pauVar9,auVar4);
            auVar23 = vpand_avx(auVar24,auVar18);
            auVar2 = vpmulhuw_avx(auVar23,auVar19);
            auVar23 = vpand_avx(auVar24,auVar20);
            auVar24 = vpsllw_avx(auVar23,8);
            auVar23 = vpsllw_avx(auVar23,4);
            auVar23 = vpblendw_avx(auVar23,auVar24,0xaa);
            auVar2 = vpor_avx(auVar23,auVar2);
            auVar24 = vpsubusb_avx(auVar2,auVar21);
            auVar23 = vpcmpgtb_avx(auVar2,auVar22);
            auVar23 = vpsubb_avx(auVar24,auVar23);
            auVar23 = vpshufb_avx(auVar5,auVar23);
            auVar23 = vpaddb_avx(auVar23,auVar2);
            *pauVar7 = auVar23;
            lVar12 = -2;
            if (uVar8 < 2) break;
          }
          else {
            auVar24 = vpshufb_avx(*pauVar9,auVar4);
            auVar23 = vpand_avx(auVar24,auVar13);
            auVar2 = vpmulhuw_avx(auVar23,auVar14);
            auVar23 = vpand_avx(auVar24,auVar15);
            auVar24 = vpsllw_avx(auVar23,8);
            auVar23 = vpsllw_avx(auVar23,4);
            auVar23 = vpblendw_avx(auVar23,auVar24,0xaa);
            auVar2 = vpor_avx(auVar23,auVar2);
            auVar24 = vpsubusb_avx(auVar2,auVar16);
            auVar23 = vpcmpgtb_avx(auVar2,auVar17);
            auVar23 = vpsubb_avx(auVar24,auVar23);
            auVar23 = vpshufb_avx(auVar5,auVar23);
            auVar23 = vpaddb_avx(auVar23,auVar2);
            *pauVar7 = auVar23;
            auVar24 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar9 + 0xc),auVar4);
            auVar23 = vpand_avx(auVar24,auVar13);
            auVar2 = vpmulhuw_avx(auVar23,auVar14);
            auVar23 = vpand_avx(auVar24,auVar15);
            auVar24 = vpsllw_avx(auVar23,8);
            auVar23 = vpsllw_avx(auVar23,4);
            auVar23 = vpblendw_avx(auVar23,auVar24,0xaa);
            auVar2 = vpor_avx(auVar23,auVar2);
            auVar24 = vpsubusb_avx(auVar2,auVar16);
            auVar23 = vpcmpgtb_avx(auVar2,auVar17);
            auVar23 = vpsubb_avx(auVar24,auVar23);
            auVar23 = vpshufb_avx(auVar5,auVar23);
            auVar23 = vpaddb_avx(auVar23,auVar2);
            pauVar7[1] = auVar23;
            auVar24 = vpshufb_avx(*(undefined1 (*) [16])(pauVar9[1] + 8),auVar4);
            auVar23 = vpand_avx(auVar24,auVar13);
            auVar2 = vpmulhuw_avx(auVar23,auVar14);
            auVar23 = vpand_avx(auVar24,auVar15);
            auVar24 = vpsllw_avx(auVar23,8);
            auVar23 = vpsllw_avx(auVar23,4);
            auVar23 = vpblendw_avx(auVar23,auVar24,0xaa);
            auVar2 = vpor_avx(auVar23,auVar2);
            auVar24 = vpsubusb_avx(auVar2,auVar16);
            auVar23 = vpcmpgtb_avx(auVar2,auVar17);
            auVar23 = vpsubb_avx(auVar24,auVar23);
            auVar23 = vpshufb_avx(auVar5,auVar23);
            auVar23 = vpaddb_avx(auVar23,auVar2);
            pauVar7[2] = auVar23;
            auVar24 = vpshufb_avx(*(undefined1 (*) [16])(pauVar9[2] + 4),auVar4);
            auVar23 = vpand_avx(auVar24,auVar13);
            auVar2 = vpmulhuw_avx(auVar23,auVar14);
            auVar23 = vpand_avx(auVar24,auVar15);
            auVar24 = vpsllw_avx(auVar23,8);
            auVar23 = vpsllw_avx(auVar23,4);
            auVar23 = vpblendw_avx(auVar23,auVar24,0xaa);
            auVar2 = vpor_avx(auVar23,auVar2);
            auVar24 = vpsubusb_avx(auVar2,auVar16);
            auVar23 = vpcmpgtb_avx(auVar2,auVar17);
            auVar23 = vpsubb_avx(auVar24,auVar23);
            auVar23 = vpshufb_avx(auVar5,auVar23);
            auVar23 = vpaddb_avx(auVar23,auVar2);
            pauVar7[3] = auVar23;
            pauVar9 = pauVar9 + 3;
            pauVar7 = pauVar7 + 4;
            lVar12 = -8;
LAB_001069fd:
            auVar24 = vpshufb_avx(*pauVar9,auVar4);
            auVar23 = vpand_avx(auVar24,auVar13);
            auVar2 = vpmulhuw_avx(auVar23,auVar14);
            auVar23 = vpand_avx(auVar24,auVar15);
            auVar24 = vpsllw_avx(auVar23,8);
            auVar23 = vpsllw_avx(auVar23,4);
            auVar23 = vpblendw_avx(auVar23,auVar24,0xaa);
            auVar2 = vpor_avx(auVar23,auVar2);
            auVar24 = vpsubusb_avx(auVar2,auVar16);
            auVar23 = vpcmpgtb_avx(auVar2,auVar17);
            auVar23 = vpsubb_avx(auVar24,auVar23);
            auVar23 = vpshufb_avx(auVar5,auVar23);
            auVar23 = vpaddb_avx(auVar23,auVar2);
            *pauVar7 = auVar23;
            auVar24 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar9 + 0xc),auVar4);
            auVar23 = vpand_avx(auVar24,auVar13);
            auVar2 = vpmulhuw_avx(auVar23,auVar14);
            auVar23 = vpand_avx(auVar24,auVar15);
            auVar24 = vpsllw_avx(auVar23,8);
            auVar23 = vpsllw_avx(auVar23,4);
            auVar23 = vpblendw_avx(auVar23,auVar24,0xaa);
            auVar2 = vpor_avx(auVar23,auVar2);
            auVar24 = vpsubusb_avx(auVar2,auVar16);
            auVar23 = vpcmpgtb_avx(auVar2,auVar17);
            auVar23 = vpsubb_avx(auVar24,auVar23);
            auVar23 = vpshufb_avx(auVar5,auVar23);
            auVar23 = vpaddb_avx(auVar23,auVar2);
            pauVar7[1] = auVar23;
            auVar24 = vpshufb_avx(*(undefined1 (*) [16])(pauVar9[1] + 8),auVar4);
            auVar23 = vpand_avx(auVar24,auVar13);
            auVar2 = vpmulhuw_avx(auVar23,auVar14);
            auVar23 = vpand_avx(auVar24,auVar15);
            auVar24 = vpsllw_avx(auVar23,8);
            auVar23 = vpsllw_avx(auVar23,4);
            auVar23 = vpblendw_avx(auVar23,auVar24,0xaa);
            auVar2 = vpor_avx(auVar23,auVar2);
            auVar24 = vpsubusb_avx(auVar2,auVar16);
            auVar23 = vpcmpgtb_avx(auVar2,auVar17);
            auVar23 = vpsubb_avx(auVar24,auVar23);
            auVar23 = vpshufb_avx(auVar5,auVar23);
            auVar23 = vpaddb_avx(auVar23,auVar2);
            pauVar7[2] = auVar23;
            src = pauVar9[2] + 4;
            out = (char *)(pauVar7 + 3);
          }
          auVar24 = vpshufb_avx(*(undefined1 (*) [16])src,auVar4);
          auVar23 = vpand_avx(auVar24,auVar18);
          auVar2 = vpmulhuw_avx(auVar23,auVar19);
          auVar23 = vpand_avx(auVar24,auVar20);
          auVar24 = vpsllw_avx(auVar23,8);
          auVar23 = vpsllw_avx(auVar23,4);
          auVar23 = vpblendw_avx(auVar23,auVar24,0xaa);
          auVar2 = vpor_avx(auVar23,auVar2);
          auVar24 = vpsubusb_avx(auVar2,auVar21);
          auVar23 = vpcmpgtb_avx(auVar2,auVar22);
          auVar23 = vpsubb_avx(auVar24,auVar23);
          auVar23 = vpshufb_avx(auVar5,auVar23);
          auVar23 = vpaddb_avx(auVar23,auVar2);
          *(undefined1 (*) [16])out = auVar23;
          src = *(undefined1 (*) [16])src + 0xc;
          out = (char *)((long)out + 0x10);
          uVar8 = uVar8 + lVar12;
          pauVar7 = (undefined1 (*) [16])out;
          pauVar9 = (undefined1 (*) [16])src;
        } while (uVar8 != 0);
      }
      if (srclen == 0) {
        uVar11 = 0;
        break;
      }
      srclen = srclen - 1;
      (*(undefined1 (*) [16])out)[0] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(byte)(*(undefined1 (*) [16])src)[0] >> 2];
      out = *(undefined1 (*) [16])out + 1;
      puVar3 = *(undefined1 (*) [16])src;
      src = *(undefined1 (*) [16])src + 1;
      bVar10 = (*puVar3 & 3) << 4;
      sVar6 = sVar6 + 1;
LAB_00106be6:
      if (srclen == 0) {
        uVar11 = 1;
        break;
      }
      srclen = srclen - 1;
      *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(byte)(bVar10 | (byte)*src >> 4)];
      out = (char *)((uint8_t *)out + 1);
      bVar10 = *src;
      src = (char *)((byte *)src + 1);
      bVar10 = (bVar10 & 0xf) << 2;
      sVar6 = sVar6 + 1;
LAB_00106c20:
      if (srclen == 0) goto LAB_00106c65;
      srclen = srclen - 1;
      *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(byte)(bVar10 | (byte)*src >> 6)];
      bVar1 = *src;
      src = (char *)((byte *)src + 1);
      ((uint8_t *)out)[1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 & 0x3f];
      out = (char *)((uint8_t *)out + 2);
      uVar8 = sVar6 + 2;
    } while( true );
  }
LAB_00106c78:
  state->bytes = uVar11;
  state->carry = bVar10;
  *outlen = sVar6;
  return;
LAB_00106c65:
  uVar11 = 2;
  goto LAB_00106c78;
}

Assistant:

BASE64_ENC_FUNCTION(avx)
{
#if HAVE_AVX
	#include "../generic/enc_head.c"
	enc_loop_ssse3(&s, &slen, &o, &olen);
	#include "../generic/enc_tail.c"
#else
	BASE64_ENC_STUB
#endif
}